

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void ITransform_Two_SSE2(uint8_t *ref,int16_t *in,uint8_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  longlong lVar23;
  longlong lVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  longlong lVar31;
  longlong lVar32;
  longlong lVar33;
  longlong lVar34;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  short sVar35;
  short sVar36;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  __m128i ref3;
  __m128i ref2;
  __m128i ref1;
  __m128i ref0;
  __m128i zero;
  __m128i shifted3;
  __m128i shifted2;
  __m128i shifted1;
  __m128i shifted0;
  __m128i tmp3_2;
  __m128i tmp2_2;
  __m128i tmp1_2;
  __m128i tmp0_2;
  __m128i d_1;
  __m128i d4_1;
  __m128i d3_1;
  __m128i d2_1;
  __m128i d1_1;
  __m128i c_1;
  __m128i c4_1;
  __m128i c3_1;
  __m128i c2_1;
  __m128i c1_1;
  __m128i b_1;
  __m128i a_1;
  __m128i dc;
  __m128i four;
  __m128i tmp3_1;
  __m128i tmp2_1;
  __m128i tmp1_1;
  __m128i tmp0_1;
  __m128i d;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i c;
  __m128i c4;
  __m128i c3;
  __m128i c2;
  __m128i c1;
  __m128i b;
  __m128i a;
  __m128i tmp3;
  __m128i tmp2;
  __m128i tmp1;
  __m128i tmp0;
  __m128i in3;
  __m128i in2;
  __m128i in1;
  __m128i in0;
  __m128i T3;
  __m128i T2;
  __m128i T1;
  __m128i T0;
  __m128i k2;
  __m128i k1;
  __m128i *in2_00;
  __m128i *in1_00;
  __m128i *in0_00;
  undefined8 local_bf8;
  ushort uStack_bf0;
  undefined8 local_be8;
  ushort uStack_be0;
  undefined8 local_bd8;
  ushort uStack_bd0;
  undefined8 local_bc8;
  ushort uStack_bc0;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined2 in_stack_fffffffffffff590;
  undefined2 in_stack_fffffffffffff592;
  undefined2 in_stack_fffffffffffff594;
  undefined2 in_stack_fffffffffffff596;
  undefined2 in_stack_fffffffffffff598;
  undefined2 in_stack_fffffffffffff59a;
  undefined2 in_stack_fffffffffffff59c;
  undefined2 in_stack_fffffffffffff59e;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined4 uStack_93c;
  undefined4 local_938;
  undefined4 uStack_92c;
  undefined4 local_928;
  undefined4 uStack_91c;
  undefined4 local_918;
  undefined4 uStack_90c;
  undefined4 local_908;
  undefined4 uStack_904;
  undefined8 local_8f8;
  undefined8 local_8e8;
  undefined8 local_8d8;
  longlong local_8c8;
  longlong lStack_8c0;
  longlong local_8b8;
  longlong lStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  longlong local_898;
  longlong lStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 *local_850;
  undefined2 local_82e;
  undefined2 local_82c;
  undefined2 local_82a;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 *local_818;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  longlong local_788;
  longlong lStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  short local_708;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  undefined8 uStack_700;
  short local_6f8;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined4 local_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined4 local_69c;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined4 local_67c;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined4 local_65c;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined2 local_638;
  undefined2 local_636;
  undefined2 local_634;
  undefined2 local_632;
  undefined2 local_630;
  undefined2 local_62e;
  undefined2 local_62c;
  undefined2 local_62a;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined2 local_618;
  undefined2 local_616;
  undefined2 local_614;
  undefined2 local_612;
  undefined2 local_610;
  undefined2 local_60e;
  undefined2 local_60c;
  undefined2 local_60a;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined2 local_5f8;
  undefined2 local_5f6;
  undefined2 local_5f4;
  undefined2 local_5f2;
  undefined2 local_5f0;
  undefined2 local_5ee;
  undefined2 local_5ec;
  undefined2 local_5ea;
  byte bStack_4d7;
  byte bStack_4d6;
  byte bStack_4d5;
  byte bStack_4d4;
  byte bStack_4d3;
  byte bStack_4d2;
  byte bStack_4d1;
  byte bStack_4b7;
  byte bStack_4b6;
  byte bStack_4b5;
  byte bStack_4b4;
  byte bStack_4b3;
  byte bStack_4b2;
  byte bStack_4b1;
  byte bStack_497;
  byte bStack_496;
  byte bStack_495;
  byte bStack_494;
  byte bStack_493;
  byte bStack_492;
  byte bStack_491;
  byte bStack_477;
  byte bStack_476;
  byte bStack_475;
  byte bStack_474;
  byte bStack_473;
  byte bStack_472;
  byte bStack_471;
  short local_3e8;
  short sStack_3e6;
  short sStack_3e4;
  short sStack_3e2;
  short sStack_3e0;
  short sStack_3de;
  short sStack_3dc;
  short sStack_3da;
  ushort uStack_3d6;
  ushort uStack_3d4;
  ushort uStack_3d2;
  ushort uStack_3ce;
  ushort uStack_3cc;
  ushort uStack_3ca;
  short local_3c8;
  short sStack_3c6;
  short sStack_3c4;
  short sStack_3c2;
  short sStack_3c0;
  short sStack_3be;
  short sStack_3bc;
  short sStack_3ba;
  ushort uStack_3b6;
  ushort uStack_3b4;
  ushort uStack_3b2;
  ushort uStack_3ae;
  ushort uStack_3ac;
  ushort uStack_3aa;
  short local_3a8;
  short sStack_3a6;
  short sStack_3a4;
  short sStack_3a2;
  short sStack_3a0;
  short sStack_39e;
  short sStack_39c;
  short sStack_39a;
  ushort uStack_396;
  ushort uStack_394;
  ushort uStack_392;
  ushort uStack_38e;
  ushort uStack_38c;
  ushort uStack_38a;
  short local_388;
  short sStack_386;
  short sStack_384;
  short sStack_382;
  short sStack_380;
  short sStack_37e;
  short sStack_37c;
  short sStack_37a;
  ushort uStack_376;
  ushort uStack_374;
  ushort uStack_372;
  ushort uStack_36e;
  ushort uStack_36c;
  ushort uStack_36a;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  longlong local_2e8;
  longlong lStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e0;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined8 uStack_100;
  longlong local_f8;
  longlong lStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 uStack_10;
  
  local_82a = 0x4e7b;
  local_62a = 0x4e7b;
  local_62c = 0x4e7b;
  local_62e = 0x4e7b;
  local_630 = 0x4e7b;
  local_632 = 0x4e7b;
  local_634 = 0x4e7b;
  local_636 = 0x4e7b;
  local_638 = 0x4e7b;
  local_878 = 0x4e7b4e7b4e7b4e7b;
  uStack_870 = 0x4e7b4e7b4e7b4e7b;
  local_82c = 0x8a8c;
  local_60a = 0x8a8c;
  local_60c = 0x8a8c;
  local_60e = 0x8a8c;
  local_610 = 0x8a8c;
  local_612 = 0x8a8c;
  local_614 = 0x8a8c;
  local_616 = 0x8a8c;
  local_618 = 0x8a8c;
  local_888 = 0x8a8c8a8c8a8c8a8c;
  uStack_880 = 0x8a8c8a8c8a8c8a8c;
  local_158 = *in_RSI;
  uStack_150 = in_RSI[1];
  local_818 = in_RSI + 2;
  local_178 = *local_818;
  uStack_170 = in_RSI[3];
  local_820 = in_RSI + 4;
  uStack_6d0 = *local_820;
  uStack_160 = in_RSI[5];
  local_828 = in_RSI + 6;
  uStack_6e0 = *local_828;
  uStack_180 = in_RSI[7];
  uStack_90c = (undefined4)((ulong)uStack_150 >> 0x20);
  uStack_92c = (undefined4)((ulong)uStack_160 >> 0x20);
  local_928 = (undefined4)local_178;
  uStack_10c = uStack_90c;
  uStack_11c = uStack_92c;
  _local_118 = CONCAT44((int)((ulong)local_158 >> 0x20),local_928);
  local_8d8 = CONCAT44(uStack_92c,uStack_120);
  uStack_91c = (undefined4)((ulong)uStack_170 >> 0x20);
  local_918 = (undefined4)local_158;
  uStack_93c = (undefined4)((ulong)uStack_180 >> 0x20);
  local_938 = (undefined4)uStack_6d0;
  uStack_12c = uStack_91c;
  _local_128 = CONCAT44((int)((ulong)uStack_6d0 >> 0x20),local_918);
  uStack_13c = uStack_93c;
  _local_138 = CONCAT44((int)((ulong)local_178 >> 0x20),local_938);
  local_8f8 = CONCAT44(uStack_93c,uStack_140);
  local_198 = local_8d8;
  uVar30 = local_198;
  local_1a8 = local_8f8;
  uVar29 = local_1a8;
  local_198._0_2_ = (short)uStack_120;
  local_198._2_2_ = (short)((uint)uStack_120 >> 0x10);
  local_198._4_2_ = (short)((ulong)uStack_160 >> 0x20);
  local_198._6_2_ = (short)((ulong)uStack_160 >> 0x30);
  uStack_190._0_2_ = (short)uStack_6d0;
  uStack_190._2_2_ = (short)((ulong)uStack_6d0 >> 0x10);
  uStack_190._4_2_ = (short)((ulong)uStack_6d0 >> 0x20);
  uStack_190._6_2_ = (short)((ulong)uStack_6d0 >> 0x30);
  local_1a8._0_2_ = (short)uStack_140;
  local_1a8._2_2_ = (short)((uint)uStack_140 >> 0x10);
  local_1a8._4_2_ = (short)((ulong)uStack_180 >> 0x20);
  local_1a8._6_2_ = (short)((ulong)uStack_180 >> 0x30);
  uStack_1a0._0_2_ = (short)uStack_6e0;
  uStack_1a0._2_2_ = (short)((ulong)uStack_6e0 >> 0x10);
  uStack_1a0._4_2_ = (short)((ulong)uStack_6e0 >> 0x20);
  uStack_1a0._6_2_ = (short)((ulong)uStack_6e0 >> 0x30);
  local_6d8 = local_8d8;
  local_6e8 = local_8f8;
  uStack_10 = CONCAT44(uStack_90c,uStack_110);
  auVar22._8_8_ = uStack_10;
  auVar22._0_8_ = local_8e8;
  auVar21._8_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar21._0_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar37 = pmulhw(auVar22,auVar21);
  auVar20._4_4_ = uStack_904;
  auVar20._0_4_ = local_908;
  uStack_30 = CONCAT44(uStack_91c,uStack_130);
  auVar20._8_8_ = uStack_30;
  auVar19._8_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar19._0_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar38 = pmulhw(auVar20,auVar19);
  local_6f8 = (short)local_8e8;
  sStack_6f6 = (short)((ulong)local_8e8 >> 0x10);
  sStack_6f4 = (short)((ulong)local_8e8 >> 0x20);
  sStack_6f2 = (short)((ulong)local_8e8 >> 0x30);
  uStack_6f0._0_2_ = (short)uStack_110;
  uStack_6f0._2_2_ = (short)((uint)uStack_110 >> 0x10);
  uStack_6f0._4_2_ = (short)((ulong)uStack_150 >> 0x20);
  uStack_6f0._6_2_ = (short)((ulong)uStack_150 >> 0x30);
  local_708 = (short)local_908;
  sStack_706 = (short)((uint)local_908 >> 0x10);
  sStack_704 = (short)uStack_904;
  sStack_702 = (short)((uint)uStack_904 >> 0x10);
  uStack_700._0_2_ = (short)uStack_130;
  uStack_700._2_2_ = (short)((uint)uStack_130 >> 0x10);
  uStack_700._4_2_ = (short)((ulong)uStack_170 >> 0x20);
  uStack_700._6_2_ = (short)((ulong)uStack_170 >> 0x30);
  local_978 = auVar37._0_8_;
  uStack_970 = auVar37._8_8_;
  local_988 = auVar38._0_8_;
  uStack_980 = auVar38._8_8_;
  local_718 = local_978;
  uVar3 = local_718;
  uStack_710 = uStack_970;
  uVar4 = uStack_710;
  local_728 = local_988;
  uVar1 = local_728;
  uStack_720 = uStack_980;
  uVar2 = uStack_720;
  local_718._0_2_ = auVar37._0_2_;
  local_718._2_2_ = auVar37._2_2_;
  local_718._4_2_ = auVar37._4_2_;
  local_718._6_2_ = auVar37._6_2_;
  uStack_710._0_2_ = auVar37._8_2_;
  uStack_710._2_2_ = auVar37._10_2_;
  uStack_710._4_2_ = auVar37._12_2_;
  uStack_710._6_2_ = auVar37._14_2_;
  local_728._0_2_ = auVar38._0_2_;
  local_728._2_2_ = auVar38._2_2_;
  local_728._4_2_ = auVar38._4_2_;
  local_728._6_2_ = auVar38._6_2_;
  uStack_720._0_2_ = auVar38._8_2_;
  uStack_720._2_2_ = auVar38._10_2_;
  uStack_720._4_2_ = auVar38._12_2_;
  uStack_720._6_2_ = auVar38._14_2_;
  local_1b8 = CONCAT26(sStack_6f2 - sStack_702,
                       CONCAT24(sStack_6f4 - sStack_704,
                                CONCAT22(sStack_6f6 - sStack_706,local_6f8 - local_708)));
  uStack_1b0 = CONCAT26(uStack_6f0._6_2_ - uStack_700._6_2_,
                        CONCAT24(uStack_6f0._4_2_ - uStack_700._4_2_,
                                 CONCAT22(uStack_6f0._2_2_ - uStack_700._2_2_,
                                          (short)uStack_6f0 - (short)uStack_700)));
  local_1c8 = CONCAT26(local_718._6_2_ - local_728._6_2_,
                       CONCAT24(local_718._4_2_ - local_728._4_2_,
                                CONCAT22(local_718._2_2_ - local_728._2_2_,
                                         (short)local_718 - (short)local_728)));
  uStack_1c0 = CONCAT26(uStack_710._6_2_ - uStack_720._6_2_,
                        CONCAT24(uStack_710._4_2_ - uStack_720._4_2_,
                                 CONCAT22(uStack_710._2_2_ - uStack_720._2_2_,
                                          (short)uStack_710 - (short)uStack_720)));
  sVar35 = (local_6f8 - local_708) + ((short)local_718 - (short)local_728);
  sVar39 = (sStack_6f6 - sStack_706) + (local_718._2_2_ - local_728._2_2_);
  sVar41 = (sStack_6f4 - sStack_704) + (local_718._4_2_ - local_728._4_2_);
  sVar43 = (sStack_6f2 - sStack_702) + (local_718._6_2_ - local_728._6_2_);
  sVar45 = ((short)uStack_6f0 - (short)uStack_700) + ((short)uStack_710 - (short)uStack_720);
  sVar50 = (uStack_6f0._2_2_ - uStack_700._2_2_) + (uStack_710._2_2_ - uStack_720._2_2_);
  sVar55 = (uStack_6f0._4_2_ - uStack_700._4_2_) + (uStack_710._4_2_ - uStack_720._4_2_);
  sVar60 = (uStack_6f0._6_2_ - uStack_700._6_2_) + (uStack_710._6_2_ - uStack_720._6_2_);
  uStack_50 = CONCAT44(uStack_90c,uStack_110);
  auVar18._8_8_ = uStack_50;
  auVar18._0_8_ = local_8e8;
  auVar17._8_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar17._0_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar37 = pmulhw(auVar18,auVar17);
  auVar16._4_4_ = uStack_904;
  auVar16._0_4_ = local_908;
  uStack_70 = CONCAT44(uStack_91c,uStack_130);
  auVar16._8_8_ = uStack_70;
  auVar15._8_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar15._0_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar38 = pmulhw(auVar16,auVar15);
  uStack_1d0 = CONCAT44(uStack_90c,uStack_110);
  uStack_1e0 = CONCAT44(uStack_91c,uStack_130);
  local_9c8 = auVar37._0_8_;
  uStack_9c0 = auVar37._8_8_;
  local_9d8 = auVar38._0_8_;
  uStack_9d0 = auVar38._8_8_;
  local_1f8 = local_9c8;
  uVar27 = local_1f8;
  uStack_1f0 = uStack_9c0;
  uVar28 = uStack_1f0;
  local_208 = local_9d8;
  uVar25 = local_208;
  uStack_200 = uStack_9d0;
  uVar26 = uStack_200;
  local_1f8._0_2_ = auVar37._0_2_;
  local_1f8._2_2_ = auVar37._2_2_;
  local_1f8._4_2_ = auVar37._4_2_;
  local_1f8._6_2_ = auVar37._6_2_;
  uStack_1f0._0_2_ = auVar37._8_2_;
  uStack_1f0._2_2_ = auVar37._10_2_;
  uStack_1f0._4_2_ = auVar37._12_2_;
  uStack_1f0._6_2_ = auVar37._14_2_;
  local_208._0_2_ = auVar38._0_2_;
  local_208._2_2_ = auVar38._2_2_;
  local_208._4_2_ = auVar38._4_2_;
  local_208._6_2_ = auVar38._6_2_;
  uStack_200._0_2_ = auVar38._8_2_;
  uStack_200._2_2_ = auVar38._10_2_;
  uStack_200._4_2_ = auVar38._12_2_;
  uStack_200._6_2_ = auVar38._14_2_;
  local_218 = CONCAT26(sStack_6f2 + sStack_702,
                       CONCAT24(sStack_6f4 + sStack_704,
                                CONCAT22(sStack_6f6 + sStack_706,local_6f8 + local_708)));
  uStack_210 = CONCAT26(uStack_6f0._6_2_ + uStack_700._6_2_,
                        CONCAT24(uStack_6f0._4_2_ + uStack_700._4_2_,
                                 CONCAT22(uStack_6f0._2_2_ + uStack_700._2_2_,
                                          (short)uStack_6f0 + (short)uStack_700)));
  local_228 = CONCAT26(local_1f8._6_2_ + local_208._6_2_,
                       CONCAT24(local_1f8._4_2_ + local_208._4_2_,
                                CONCAT22(local_1f8._2_2_ + local_208._2_2_,
                                         (short)local_1f8 + (short)local_208)));
  uStack_220 = CONCAT26(uStack_1f0._6_2_ + uStack_200._6_2_,
                        CONCAT24(uStack_1f0._4_2_ + uStack_200._4_2_,
                                 CONCAT22(uStack_1f0._2_2_ + uStack_200._2_2_,
                                          (short)uStack_1f0 + (short)uStack_200)));
  sVar36 = local_6f8 + local_708 + (short)local_1f8 + (short)local_208;
  sVar40 = sStack_6f6 + sStack_706 + local_1f8._2_2_ + local_208._2_2_;
  sVar42 = sStack_6f4 + sStack_704 + local_1f8._4_2_ + local_208._4_2_;
  sVar44 = sStack_6f2 + sStack_702 + local_1f8._6_2_ + local_208._6_2_;
  sVar46 = (short)uStack_6f0 + (short)uStack_700 + (short)uStack_1f0 + (short)uStack_200;
  sVar51 = uStack_6f0._2_2_ + uStack_700._2_2_ + uStack_1f0._2_2_ + uStack_200._2_2_;
  sVar56 = uStack_6f0._4_2_ + uStack_700._4_2_ + uStack_1f0._4_2_ + uStack_200._4_2_;
  sVar61 = uStack_6f0._6_2_ + uStack_700._6_2_ + uStack_1f0._6_2_ + uStack_200._6_2_;
  local_238 = CONCAT26(local_198._6_2_ + local_1a8._6_2_,
                       CONCAT24(local_198._4_2_ + local_1a8._4_2_,
                                CONCAT22(local_198._2_2_ + local_1a8._2_2_,
                                         (short)local_198 + (short)local_1a8)));
  uStack_230 = CONCAT26(uStack_190._6_2_ + uStack_1a0._6_2_,
                        CONCAT24(uStack_190._4_2_ + uStack_1a0._4_2_,
                                 CONCAT22(uStack_190._2_2_ + uStack_1a0._2_2_,
                                          (short)uStack_190 + (short)uStack_1a0)));
  local_248 = CONCAT26(sVar44,CONCAT24(sVar42,CONCAT22(sVar40,sVar36)));
  uStack_240 = CONCAT26(sVar61,CONCAT24(sVar56,CONCAT22(sVar51,sVar46)));
  local_258 = CONCAT26(local_198._6_2_ - local_1a8._6_2_,
                       CONCAT24(local_198._4_2_ - local_1a8._4_2_,
                                CONCAT22(local_198._2_2_ - local_1a8._2_2_,
                                         (short)local_198 - (short)local_1a8)));
  uStack_250 = CONCAT26(uStack_190._6_2_ - uStack_1a0._6_2_,
                        CONCAT24(uStack_190._4_2_ - uStack_1a0._4_2_,
                                 CONCAT22(uStack_190._2_2_ - uStack_1a0._2_2_,
                                          (short)uStack_190 - (short)uStack_1a0)));
  local_268 = CONCAT26(sVar43,CONCAT24(sVar41,CONCAT22(sVar39,sVar35)));
  uStack_260 = CONCAT26(sVar60,CONCAT24(sVar55,CONCAT22(sVar50,sVar45)));
  local_738 = CONCAT26(local_198._6_2_ - local_1a8._6_2_,
                       CONCAT24(local_198._4_2_ - local_1a8._4_2_,
                                CONCAT22(local_198._2_2_ - local_1a8._2_2_,
                                         (short)local_198 - (short)local_1a8)));
  uStack_730 = CONCAT26(uStack_190._6_2_ - uStack_1a0._6_2_,
                        CONCAT24(uStack_190._4_2_ - uStack_1a0._4_2_,
                                 CONCAT22(uStack_190._2_2_ - uStack_1a0._2_2_,
                                          (short)uStack_190 - (short)uStack_1a0)));
  local_748 = CONCAT26(sVar43,CONCAT24(sVar41,CONCAT22(sVar39,sVar35)));
  uStack_740 = CONCAT26(sVar60,CONCAT24(sVar55,CONCAT22(sVar50,sVar45)));
  local_758 = CONCAT26(local_198._6_2_ + local_1a8._6_2_,
                       CONCAT24(local_198._4_2_ + local_1a8._4_2_,
                                CONCAT22(local_198._2_2_ + local_1a8._2_2_,
                                         (short)local_198 + (short)local_1a8)));
  uStack_750 = CONCAT26(uStack_190._6_2_ + uStack_1a0._6_2_,
                        CONCAT24(uStack_190._4_2_ + uStack_1a0._4_2_,
                                 CONCAT22(uStack_190._2_2_ + uStack_1a0._2_2_,
                                          (short)uStack_190 + (short)uStack_1a0)));
  local_768 = CONCAT26(sVar44,CONCAT24(sVar42,CONCAT22(sVar40,sVar36)));
  uStack_760 = CONCAT26(sVar61,CONCAT24(sVar56,CONCAT22(sVar51,sVar46)));
  in2_00 = (__m128i *)&local_8c8;
  in1_00 = (__m128i *)&local_8b8;
  in0_00 = (__m128i *)&local_898;
  local_860 = in_RDX;
  local_850 = in_RDI;
  local_728 = uVar1;
  uStack_720 = uVar2;
  local_718 = uVar3;
  uStack_710 = uVar4;
  uStack_700 = CONCAT44(uStack_91c,uStack_130);
  uStack_6f0 = CONCAT44(uStack_90c,uStack_110);
  local_648 = local_878;
  uStack_640 = uStack_870;
  local_628 = local_888;
  uStack_620 = uStack_880;
  local_208 = uVar25;
  uStack_200 = uVar26;
  local_1f8 = uVar27;
  uStack_1f0 = uVar28;
  local_1a8 = uVar29;
  uStack_1a0 = uStack_6e0;
  local_198 = uVar30;
  uStack_190 = uStack_6d0;
  local_188 = uStack_6e0;
  local_168 = uStack_6d0;
  local_148 = uStack_6e0;
  local_88 = local_888;
  uStack_80 = uStack_880;
  local_68 = local_878;
  uStack_60 = uStack_870;
  local_48 = local_878;
  uStack_40 = uStack_870;
  local_28 = local_888;
  uStack_20 = uStack_880;
  VP8Transpose_2_4x4_16b
            (in0_00,in1_00,in2_00,in2_00,in1_00,(__m128i *)0x167f06,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffff596,
                      CONCAT24(in_stack_fffffffffffff594,
                               CONCAT22(in_stack_fffffffffffff592,in_stack_fffffffffffff590))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffff59e,
                      CONCAT24(in_stack_fffffffffffff59c,
                               CONCAT22(in_stack_fffffffffffff59a,in_stack_fffffffffffff598))));
  local_82e = 4;
  local_5ea = 4;
  local_5ec = 4;
  local_5ee = 4;
  local_5f0 = 4;
  local_5f2 = 4;
  local_5f4 = 4;
  local_5f6 = 4;
  local_5f8 = 4;
  local_608 = 0x4000400040004;
  uStack_600 = 0x4000400040004;
  local_278 = local_898;
  lVar33 = local_278;
  uStack_270 = lStack_890;
  lVar34 = uStack_270;
  local_278._0_2_ = (short)local_898;
  local_278._2_2_ = (short)((ulong)local_898 >> 0x10);
  local_278._4_2_ = (short)((ulong)local_898 >> 0x20);
  local_278._6_2_ = (short)((ulong)local_898 >> 0x30);
  uStack_270._0_2_ = (short)lStack_890;
  uStack_270._2_2_ = (short)((ulong)lStack_890 >> 0x10);
  uStack_270._4_2_ = (short)((ulong)lStack_890 >> 0x20);
  uStack_270._6_2_ = (short)((ulong)lStack_890 >> 0x30);
  sVar35 = (short)local_278 + 4;
  sVar41 = local_278._2_2_ + 4;
  sVar45 = local_278._4_2_ + 4;
  sVar55 = local_278._6_2_ + 4;
  uStack_270._0_2_ = (short)uStack_270 + 4;
  uStack_270._2_2_ = uStack_270._2_2_ + 4;
  uStack_270._4_2_ = uStack_270._4_2_ + 4;
  uStack_270._6_2_ = uStack_270._6_2_ + 4;
  local_298 = CONCAT26(sVar55,CONCAT24(sVar45,CONCAT22(sVar41,sVar35)));
  uStack_290 = CONCAT26(uStack_270._6_2_,
                        CONCAT24(uStack_270._4_2_,CONCAT22(uStack_270._2_2_,(short)uStack_270)));
  local_2a8 = local_8b8;
  lVar31 = local_2a8;
  uStack_2a0 = lStack_8b0;
  lVar32 = uStack_2a0;
  local_2a8._0_2_ = (short)local_8b8;
  local_2a8._2_2_ = (short)((ulong)local_8b8 >> 0x10);
  local_2a8._4_2_ = (short)((ulong)local_8b8 >> 0x20);
  local_2a8._6_2_ = (short)((ulong)local_8b8 >> 0x30);
  uStack_2a0._0_2_ = (short)lStack_8b0;
  uStack_2a0._2_2_ = (short)((ulong)lStack_8b0 >> 0x10);
  uStack_2a0._4_2_ = (short)((ulong)lStack_8b0 >> 0x20);
  uStack_2a0._6_2_ = (short)((ulong)lStack_8b0 >> 0x30);
  sVar36 = sVar35 + (short)local_2a8;
  sVar42 = sVar41 + local_2a8._2_2_;
  sVar46 = sVar45 + local_2a8._4_2_;
  sVar56 = sVar55 + local_2a8._6_2_;
  sVar47 = (short)uStack_270 + (short)uStack_2a0;
  sVar52 = uStack_270._2_2_ + uStack_2a0._2_2_;
  sVar57 = uStack_270._4_2_ + uStack_2a0._4_2_;
  sVar62 = uStack_270._6_2_ + uStack_2a0._6_2_;
  local_778 = CONCAT26(sVar55,CONCAT24(sVar45,CONCAT22(sVar41,sVar35)));
  uStack_770 = CONCAT26(uStack_270._6_2_,
                        CONCAT24(uStack_270._4_2_,CONCAT22(uStack_270._2_2_,(short)uStack_270)));
  local_788 = local_8b8;
  lStack_780 = lStack_8b0;
  local_2a8._0_2_ = sVar35 - (short)local_2a8;
  local_2a8._2_2_ = sVar41 - local_2a8._2_2_;
  local_2a8._4_2_ = sVar45 - local_2a8._4_2_;
  local_2a8._6_2_ = sVar55 - local_2a8._6_2_;
  uStack_270._0_2_ = (short)uStack_270 - (short)uStack_2a0;
  uStack_270._2_2_ = uStack_270._2_2_ - uStack_2a0._2_2_;
  uStack_270._4_2_ = uStack_270._4_2_ - uStack_2a0._4_2_;
  uStack_270._6_2_ = uStack_270._6_2_ - uStack_2a0._6_2_;
  local_98 = local_8a8;
  uStack_90 = uStack_8a0;
  local_a8 = local_888;
  uStack_a0 = uStack_880;
  auVar14._8_8_ = uStack_8a0;
  auVar14._0_8_ = local_8a8;
  auVar13._8_8_ = uStack_880;
  auVar13._0_8_ = local_888;
  auVar37 = pmulhw(auVar14,auVar13);
  local_b8 = local_8c8;
  lStack_b0 = lStack_8c0;
  local_c8 = local_878;
  uStack_c0 = uStack_870;
  auVar12._8_8_ = lStack_8c0;
  auVar12._0_8_ = local_8c8;
  auVar11._8_8_ = uStack_870;
  auVar11._0_8_ = local_878;
  auVar38 = pmulhw(auVar12,auVar11);
  local_798 = local_8a8;
  uVar25 = local_798;
  uStack_790 = uStack_8a0;
  uVar26 = uStack_790;
  local_7a8 = local_8c8;
  lVar23 = local_7a8;
  uStack_7a0 = lStack_8c0;
  lVar24 = uStack_7a0;
  local_798._0_2_ = (short)local_8a8;
  local_798._2_2_ = (short)((ulong)local_8a8 >> 0x10);
  local_798._4_2_ = (short)((ulong)local_8a8 >> 0x20);
  local_798._6_2_ = (short)((ulong)local_8a8 >> 0x30);
  uStack_790._0_2_ = (short)uStack_8a0;
  uStack_790._2_2_ = (short)((ulong)uStack_8a0 >> 0x10);
  uStack_790._4_2_ = (short)((ulong)uStack_8a0 >> 0x20);
  uStack_790._6_2_ = (short)((ulong)uStack_8a0 >> 0x30);
  local_7a8._0_2_ = (short)local_8c8;
  local_7a8._2_2_ = (short)((ulong)local_8c8 >> 0x10);
  local_7a8._4_2_ = (short)((ulong)local_8c8 >> 0x20);
  local_7a8._6_2_ = (short)((ulong)local_8c8 >> 0x30);
  uStack_7a0._0_2_ = (short)lStack_8c0;
  uStack_7a0._2_2_ = (short)((ulong)lStack_8c0 >> 0x10);
  uStack_7a0._4_2_ = (short)((ulong)lStack_8c0 >> 0x20);
  uStack_7a0._6_2_ = (short)((ulong)lStack_8c0 >> 0x30);
  local_a98 = auVar37._0_8_;
  uStack_a90 = auVar37._8_8_;
  local_aa8 = auVar38._0_8_;
  uStack_aa0 = auVar38._8_8_;
  local_7b8 = local_a98;
  uVar3 = local_7b8;
  uStack_7b0 = uStack_a90;
  uVar4 = uStack_7b0;
  local_7c8 = local_aa8;
  uVar1 = local_7c8;
  uStack_7c0 = uStack_aa0;
  uVar2 = uStack_7c0;
  local_7b8._0_2_ = auVar37._0_2_;
  local_7b8._2_2_ = auVar37._2_2_;
  local_7b8._4_2_ = auVar37._4_2_;
  local_7b8._6_2_ = auVar37._6_2_;
  uStack_7b0._0_2_ = auVar37._8_2_;
  uStack_7b0._2_2_ = auVar37._10_2_;
  uStack_7b0._4_2_ = auVar37._12_2_;
  uStack_7b0._6_2_ = auVar37._14_2_;
  local_7c8._0_2_ = auVar38._0_2_;
  local_7c8._2_2_ = auVar38._2_2_;
  local_7c8._4_2_ = auVar38._4_2_;
  local_7c8._6_2_ = auVar38._6_2_;
  uStack_7c0._0_2_ = auVar38._8_2_;
  uStack_7c0._2_2_ = auVar38._10_2_;
  uStack_7c0._4_2_ = auVar38._12_2_;
  uStack_7c0._6_2_ = auVar38._14_2_;
  local_2b8 = CONCAT26(local_798._6_2_ - local_7a8._6_2_,
                       CONCAT24(local_798._4_2_ - local_7a8._4_2_,
                                CONCAT22(local_798._2_2_ - local_7a8._2_2_,
                                         (short)local_798 - (short)local_7a8)));
  uStack_2b0 = CONCAT26(uStack_790._6_2_ - uStack_7a0._6_2_,
                        CONCAT24(uStack_790._4_2_ - uStack_7a0._4_2_,
                                 CONCAT22(uStack_790._2_2_ - uStack_7a0._2_2_,
                                          (short)uStack_790 - (short)uStack_7a0)));
  local_2c8 = CONCAT26(local_7b8._6_2_ - local_7c8._6_2_,
                       CONCAT24(local_7b8._4_2_ - local_7c8._4_2_,
                                CONCAT22(local_7b8._2_2_ - local_7c8._2_2_,
                                         (short)local_7b8 - (short)local_7c8)));
  uStack_2c0 = CONCAT26(uStack_7b0._6_2_ - uStack_7c0._6_2_,
                        CONCAT24(uStack_7b0._4_2_ - uStack_7c0._4_2_,
                                 CONCAT22(uStack_7b0._2_2_ - uStack_7c0._2_2_,
                                          (short)uStack_7b0 - (short)uStack_7c0)));
  sVar39 = ((short)local_798 - (short)local_7a8) + ((short)local_7b8 - (short)local_7c8);
  sVar43 = (local_798._2_2_ - local_7a8._2_2_) + (local_7b8._2_2_ - local_7c8._2_2_);
  sVar50 = (local_798._4_2_ - local_7a8._4_2_) + (local_7b8._4_2_ - local_7c8._4_2_);
  sVar60 = (local_798._6_2_ - local_7a8._6_2_) + (local_7b8._6_2_ - local_7c8._6_2_);
  sVar48 = ((short)uStack_790 - (short)uStack_7a0) + ((short)uStack_7b0 - (short)uStack_7c0);
  sVar53 = (uStack_790._2_2_ - uStack_7a0._2_2_) + (uStack_7b0._2_2_ - uStack_7c0._2_2_);
  sVar58 = (uStack_790._4_2_ - uStack_7a0._4_2_) + (uStack_7b0._4_2_ - uStack_7c0._4_2_);
  sVar63 = (uStack_790._6_2_ - uStack_7a0._6_2_) + (uStack_7b0._6_2_ - uStack_7c0._6_2_);
  local_d8 = local_8a8;
  uStack_d0 = uStack_8a0;
  local_e8 = local_878;
  uStack_e0 = uStack_870;
  auVar10._8_8_ = uStack_8a0;
  auVar10._0_8_ = local_8a8;
  auVar9._8_8_ = uStack_870;
  auVar9._0_8_ = local_878;
  auVar37 = pmulhw(auVar10,auVar9);
  local_f8 = local_8c8;
  lStack_f0 = lStack_8c0;
  local_108 = (undefined4)local_888;
  uStack_104 = (undefined4)((ulong)local_888 >> 0x20);
  uStack_100 = uStack_880;
  auVar8._8_8_ = lStack_8c0;
  auVar8._0_8_ = local_8c8;
  auVar7._8_8_ = uStack_880;
  auVar7._0_8_ = local_888;
  auVar38 = pmulhw(auVar8,auVar7);
  local_2d8 = local_8a8;
  uStack_2d0 = uStack_8a0;
  local_2e8 = local_8c8;
  lStack_2e0 = lStack_8c0;
  local_ae8 = auVar37._0_8_;
  uStack_ae0 = auVar37._8_8_;
  local_af8 = auVar38._0_8_;
  uStack_af0 = auVar38._8_8_;
  local_2f8 = local_ae8;
  uVar29 = local_2f8;
  uStack_2f0 = uStack_ae0;
  uVar30 = uStack_2f0;
  local_308 = local_af8;
  uVar27 = local_308;
  uStack_300 = uStack_af0;
  uVar28 = uStack_300;
  local_2f8._0_2_ = auVar37._0_2_;
  local_2f8._2_2_ = auVar37._2_2_;
  local_2f8._4_2_ = auVar37._4_2_;
  local_2f8._6_2_ = auVar37._6_2_;
  uStack_2f0._0_2_ = auVar37._8_2_;
  uStack_2f0._2_2_ = auVar37._10_2_;
  uStack_2f0._4_2_ = auVar37._12_2_;
  uStack_2f0._6_2_ = auVar37._14_2_;
  local_308._0_2_ = auVar38._0_2_;
  local_308._2_2_ = auVar38._2_2_;
  local_308._4_2_ = auVar38._4_2_;
  local_308._6_2_ = auVar38._6_2_;
  uStack_300._0_2_ = auVar38._8_2_;
  uStack_300._2_2_ = auVar38._10_2_;
  uStack_300._4_2_ = auVar38._12_2_;
  uStack_300._6_2_ = auVar38._14_2_;
  local_318 = CONCAT26(local_798._6_2_ + local_7a8._6_2_,
                       CONCAT24(local_798._4_2_ + local_7a8._4_2_,
                                CONCAT22(local_798._2_2_ + local_7a8._2_2_,
                                         (short)local_798 + (short)local_7a8)));
  uStack_310 = CONCAT26(uStack_790._6_2_ + uStack_7a0._6_2_,
                        CONCAT24(uStack_790._4_2_ + uStack_7a0._4_2_,
                                 CONCAT22(uStack_790._2_2_ + uStack_7a0._2_2_,
                                          (short)uStack_790 + (short)uStack_7a0)));
  local_328 = CONCAT26(local_2f8._6_2_ + local_308._6_2_,
                       CONCAT24(local_2f8._4_2_ + local_308._4_2_,
                                CONCAT22(local_2f8._2_2_ + local_308._2_2_,
                                         (short)local_2f8 + (short)local_308)));
  uStack_320 = CONCAT26(uStack_2f0._6_2_ + uStack_300._6_2_,
                        CONCAT24(uStack_2f0._4_2_ + uStack_300._4_2_,
                                 CONCAT22(uStack_2f0._2_2_ + uStack_300._2_2_,
                                          (short)uStack_2f0 + (short)uStack_300)));
  sVar40 = (short)local_798 + (short)local_7a8 + (short)local_2f8 + (short)local_308;
  sVar44 = local_798._2_2_ + local_7a8._2_2_ + local_2f8._2_2_ + local_308._2_2_;
  sVar51 = local_798._4_2_ + local_7a8._4_2_ + local_2f8._4_2_ + local_308._4_2_;
  sVar61 = local_798._6_2_ + local_7a8._6_2_ + local_2f8._6_2_ + local_308._6_2_;
  sVar49 = (short)uStack_790 + (short)uStack_7a0 + (short)uStack_2f0 + (short)uStack_300;
  sVar54 = uStack_790._2_2_ + uStack_7a0._2_2_ + uStack_2f0._2_2_ + uStack_300._2_2_;
  sVar59 = uStack_790._4_2_ + uStack_7a0._4_2_ + uStack_2f0._4_2_ + uStack_300._4_2_;
  sVar64 = uStack_790._6_2_ + uStack_7a0._6_2_ + uStack_2f0._6_2_ + uStack_300._6_2_;
  local_338 = CONCAT26(sVar56,CONCAT24(sVar46,CONCAT22(sVar42,sVar36)));
  uStack_330 = CONCAT26(sVar62,CONCAT24(sVar57,CONCAT22(sVar52,sVar47)));
  local_348 = CONCAT26(sVar61,CONCAT24(sVar51,CONCAT22(sVar44,sVar40)));
  uStack_340 = CONCAT26(sVar64,CONCAT24(sVar59,CONCAT22(sVar54,sVar49)));
  local_358 = CONCAT26(local_2a8._6_2_,
                       CONCAT24(local_2a8._4_2_,CONCAT22(local_2a8._2_2_,(short)local_2a8)));
  uStack_350 = CONCAT26(uStack_270._6_2_,
                        CONCAT24(uStack_270._4_2_,CONCAT22(uStack_270._2_2_,(short)uStack_270)));
  local_368 = CONCAT26(sVar60,CONCAT24(sVar50,CONCAT22(sVar43,sVar39)));
  uStack_360 = CONCAT26(sVar63,CONCAT24(sVar58,CONCAT22(sVar53,sVar48)));
  local_7d8 = CONCAT26(local_2a8._6_2_,
                       CONCAT24(local_2a8._4_2_,CONCAT22(local_2a8._2_2_,(short)local_2a8)));
  uStack_7d0 = CONCAT26(uStack_270._6_2_,
                        CONCAT24(uStack_270._4_2_,CONCAT22(uStack_270._2_2_,(short)uStack_270)));
  local_7e8 = CONCAT26(sVar60,CONCAT24(sVar50,CONCAT22(sVar43,sVar39)));
  uStack_7e0 = CONCAT26(sVar63,CONCAT24(sVar58,CONCAT22(sVar53,sVar48)));
  local_7f8 = CONCAT26(sVar56,CONCAT24(sVar46,CONCAT22(sVar42,sVar36)));
  uStack_7f0 = CONCAT26(sVar62,CONCAT24(sVar57,CONCAT22(sVar52,sVar47)));
  local_808 = CONCAT26(sVar61,CONCAT24(sVar51,CONCAT22(sVar44,sVar40)));
  uStack_800 = CONCAT26(sVar64,CONCAT24(sVar59,CONCAT22(sVar54,sVar49)));
  local_658 = CONCAT26(sVar56 + sVar61,
                       CONCAT24(sVar46 + sVar51,CONCAT22(sVar42 + sVar44,sVar36 + sVar40)));
  uStack_650 = CONCAT26(sVar62 + sVar64,
                        CONCAT24(sVar57 + sVar59,CONCAT22(sVar52 + sVar54,sVar47 + sVar49)));
  local_65c = 3;
  auVar6._8_8_ = uStack_650;
  auVar6._0_8_ = local_658;
  psraw(auVar6,ZEXT416(3));
  local_678 = CONCAT26(local_2a8._6_2_ + sVar60,
                       CONCAT24(local_2a8._4_2_ + sVar50,
                                CONCAT22(local_2a8._2_2_ + sVar43,(short)local_2a8 + sVar39)));
  uStack_670 = CONCAT26(uStack_270._6_2_ + sVar63,
                        CONCAT24(uStack_270._4_2_ + sVar58,
                                 CONCAT22(uStack_270._2_2_ + sVar53,(short)uStack_270 + sVar48)));
  local_67c = 3;
  auVar5._8_8_ = uStack_670;
  auVar5._0_8_ = local_678;
  psraw(auVar5,ZEXT416(3));
  local_698 = CONCAT26(local_2a8._6_2_ - sVar60,
                       CONCAT24(local_2a8._4_2_ - sVar50,
                                CONCAT22(local_2a8._2_2_ - sVar43,(short)local_2a8 - sVar39)));
  uStack_690 = CONCAT26(uStack_270._6_2_ - sVar63,
                        CONCAT24(uStack_270._4_2_ - sVar58,
                                 CONCAT22(uStack_270._2_2_ - sVar53,(short)uStack_270 - sVar48)));
  local_69c = 3;
  auVar38._8_8_ = uStack_690;
  auVar38._0_8_ = local_698;
  psraw(auVar38,ZEXT416(3));
  local_6b8 = CONCAT26(sVar56 - sVar61,
                       CONCAT24(sVar46 - sVar51,CONCAT22(sVar42 - sVar44,sVar36 - sVar40)));
  uStack_6b0 = CONCAT26(sVar62 - sVar64,
                        CONCAT24(sVar57 - sVar59,CONCAT22(sVar52 - sVar54,sVar47 - sVar49)));
  local_6bc = 3;
  auVar37._8_8_ = uStack_6b0;
  auVar37._0_8_ = local_6b8;
  psraw(auVar37,ZEXT416(3));
  local_7c8 = uVar1;
  uStack_7c0 = uVar2;
  local_7b8 = uVar3;
  uStack_7b0 = uVar4;
  local_7a8 = lVar23;
  uStack_7a0 = lVar24;
  local_798 = uVar25;
  uStack_790 = uVar26;
  local_308 = uVar27;
  uStack_300 = uVar28;
  local_2f8 = uVar29;
  uStack_2f0 = uVar30;
  local_2a8 = lVar31;
  uStack_2a0 = lVar32;
  local_288 = local_608;
  uStack_280 = uStack_600;
  local_278 = lVar33;
  uStack_270 = lVar34;
  VP8Transpose_2_4x4_16b
            (in0_00,in1_00,in2_00,in2_00,in1_00,(__m128i *)0x16850b,
             (__m128i *)CONCAT26(sVar62,CONCAT24(sVar57,CONCAT22(sVar52,sVar47))),
             (__m128i *)CONCAT26(sVar55,CONCAT24(sVar45,CONCAT22(sVar41,sVar35))));
  uVar1 = *local_850;
  uVar2 = local_850[4];
  uVar3 = local_850[8];
  uVar4 = local_850[0xc];
  bStack_477 = (byte)((ulong)uVar1 >> 8);
  bStack_476 = (byte)((ulong)uVar1 >> 0x10);
  bStack_475 = (byte)((ulong)uVar1 >> 0x18);
  bStack_474 = (byte)((ulong)uVar1 >> 0x20);
  bStack_473 = (byte)((ulong)uVar1 >> 0x28);
  bStack_472 = (byte)((ulong)uVar1 >> 0x30);
  bStack_471 = (byte)((ulong)uVar1 >> 0x38);
  local_bc8._0_2_ = (ushort)(byte)uVar1;
  uStack_bc0 = (ushort)bStack_474;
  bStack_497 = (byte)((ulong)uVar2 >> 8);
  bStack_496 = (byte)((ulong)uVar2 >> 0x10);
  bStack_495 = (byte)((ulong)uVar2 >> 0x18);
  bStack_494 = (byte)((ulong)uVar2 >> 0x20);
  bStack_493 = (byte)((ulong)uVar2 >> 0x28);
  bStack_492 = (byte)((ulong)uVar2 >> 0x30);
  bStack_491 = (byte)((ulong)uVar2 >> 0x38);
  local_bd8._0_2_ = (ushort)(byte)uVar2;
  uStack_bd0 = (ushort)bStack_494;
  bStack_4b7 = (byte)((ulong)uVar3 >> 8);
  bStack_4b6 = (byte)((ulong)uVar3 >> 0x10);
  bStack_4b5 = (byte)((ulong)uVar3 >> 0x18);
  bStack_4b4 = (byte)((ulong)uVar3 >> 0x20);
  bStack_4b3 = (byte)((ulong)uVar3 >> 0x28);
  bStack_4b2 = (byte)((ulong)uVar3 >> 0x30);
  bStack_4b1 = (byte)((ulong)uVar3 >> 0x38);
  local_be8._0_2_ = (ushort)(byte)uVar3;
  uStack_be0 = (ushort)bStack_4b4;
  bStack_4d7 = (byte)((ulong)uVar4 >> 8);
  bStack_4d6 = (byte)((ulong)uVar4 >> 0x10);
  bStack_4d5 = (byte)((ulong)uVar4 >> 0x18);
  bStack_4d4 = (byte)((ulong)uVar4 >> 0x20);
  bStack_4d3 = (byte)((ulong)uVar4 >> 0x28);
  bStack_4d2 = (byte)((ulong)uVar4 >> 0x30);
  bStack_4d1 = (byte)((ulong)uVar4 >> 0x38);
  local_bf8._0_2_ = (ushort)(byte)uVar4;
  uStack_bf0 = (ushort)bStack_4d4;
  uStack_376 = (ushort)bStack_477;
  uStack_374 = (ushort)bStack_476;
  uStack_372 = (ushort)bStack_475;
  uStack_36e = (ushort)bStack_473;
  uStack_36c = (ushort)bStack_472;
  uStack_36a = (ushort)bStack_471;
  local_388 = (short)local_898;
  sStack_386 = (short)((ulong)local_898 >> 0x10);
  sStack_384 = (short)((ulong)local_898 >> 0x20);
  sStack_382 = (short)((ulong)local_898 >> 0x30);
  sStack_380 = (short)lStack_890;
  sStack_37e = (short)((ulong)lStack_890 >> 0x10);
  sStack_37c = (short)((ulong)lStack_890 >> 0x20);
  sStack_37a = (short)((ulong)lStack_890 >> 0x30);
  local_388 = (ushort)local_bc8 + local_388;
  sStack_386 = uStack_376 + sStack_386;
  sStack_384 = uStack_374 + sStack_384;
  sStack_382 = uStack_372 + sStack_382;
  sStack_380 = uStack_bc0 + sStack_380;
  sStack_37e = uStack_36e + sStack_37e;
  sStack_37c = uStack_36c + sStack_37c;
  sStack_37a = uStack_36a + sStack_37a;
  uStack_396 = (ushort)bStack_497;
  uStack_394 = (ushort)bStack_496;
  uStack_392 = (ushort)bStack_495;
  uStack_38e = (ushort)bStack_493;
  uStack_38c = (ushort)bStack_492;
  uStack_38a = (ushort)bStack_491;
  local_3a8 = (short)local_8a8;
  sStack_3a6 = (short)((ulong)local_8a8 >> 0x10);
  sStack_3a4 = (short)((ulong)local_8a8 >> 0x20);
  sStack_3a2 = (short)((ulong)local_8a8 >> 0x30);
  sStack_3a0 = (short)uStack_8a0;
  sStack_39e = (short)((ulong)uStack_8a0 >> 0x10);
  sStack_39c = (short)((ulong)uStack_8a0 >> 0x20);
  sStack_39a = (short)((ulong)uStack_8a0 >> 0x30);
  local_3a8 = (ushort)local_bd8 + local_3a8;
  sStack_3a6 = uStack_396 + sStack_3a6;
  sStack_3a4 = uStack_394 + sStack_3a4;
  sStack_3a2 = uStack_392 + sStack_3a2;
  sStack_3a0 = uStack_bd0 + sStack_3a0;
  sStack_39e = uStack_38e + sStack_39e;
  sStack_39c = uStack_38c + sStack_39c;
  sStack_39a = uStack_38a + sStack_39a;
  uStack_3b6 = (ushort)bStack_4b7;
  uStack_3b4 = (ushort)bStack_4b6;
  uStack_3b2 = (ushort)bStack_4b5;
  uStack_3ae = (ushort)bStack_4b3;
  uStack_3ac = (ushort)bStack_4b2;
  uStack_3aa = (ushort)bStack_4b1;
  local_3c8 = (short)local_8b8;
  sStack_3c6 = (short)((ulong)local_8b8 >> 0x10);
  sStack_3c4 = (short)((ulong)local_8b8 >> 0x20);
  sStack_3c2 = (short)((ulong)local_8b8 >> 0x30);
  sStack_3c0 = (short)lStack_8b0;
  sStack_3be = (short)((ulong)lStack_8b0 >> 0x10);
  sStack_3bc = (short)((ulong)lStack_8b0 >> 0x20);
  sStack_3ba = (short)((ulong)lStack_8b0 >> 0x30);
  local_3c8 = (ushort)local_be8 + local_3c8;
  sStack_3c6 = uStack_3b6 + sStack_3c6;
  sStack_3c4 = uStack_3b4 + sStack_3c4;
  sStack_3c2 = uStack_3b2 + sStack_3c2;
  sStack_3c0 = uStack_be0 + sStack_3c0;
  sStack_3be = uStack_3ae + sStack_3be;
  sStack_3bc = uStack_3ac + sStack_3bc;
  sStack_3ba = uStack_3aa + sStack_3ba;
  uStack_3d6 = (ushort)bStack_4d7;
  uStack_3d4 = (ushort)bStack_4d6;
  uStack_3d2 = (ushort)bStack_4d5;
  uStack_3ce = (ushort)bStack_4d3;
  uStack_3cc = (ushort)bStack_4d2;
  uStack_3ca = (ushort)bStack_4d1;
  local_3e8 = (short)local_8c8;
  sStack_3e6 = (short)((ulong)local_8c8 >> 0x10);
  sStack_3e4 = (short)((ulong)local_8c8 >> 0x20);
  sStack_3e2 = (short)((ulong)local_8c8 >> 0x30);
  sStack_3e0 = (short)lStack_8c0;
  sStack_3de = (short)((ulong)lStack_8c0 >> 0x10);
  sStack_3dc = (short)((ulong)lStack_8c0 >> 0x20);
  sStack_3da = (short)((ulong)lStack_8c0 >> 0x30);
  local_3e8 = (ushort)local_bf8 + local_3e8;
  sStack_3e6 = uStack_3d6 + sStack_3e6;
  sStack_3e4 = uStack_3d4 + sStack_3e4;
  sStack_3e2 = uStack_3d2 + sStack_3e2;
  sStack_3e0 = uStack_bf0 + sStack_3e0;
  sStack_3de = uStack_3ce + sStack_3de;
  sStack_3dc = uStack_3cc + sStack_3dc;
  sStack_3da = uStack_3ca + sStack_3da;
  local_bc8._0_2_ =
       CONCAT11((0 < sStack_386) * (sStack_386 < 0x100) * (char)sStack_386 - (0xff < sStack_386),
                (0 < local_388) * (local_388 < 0x100) * (char)local_388 - (0xff < local_388));
  local_bc8 = CONCAT17((0 < sStack_37a) * (sStack_37a < 0x100) * (char)sStack_37a -
                       (0xff < sStack_37a),
                       CONCAT16((0 < sStack_37c) * (sStack_37c < 0x100) * (char)sStack_37c -
                                (0xff < sStack_37c),
                                CONCAT15((0 < sStack_37e) * (sStack_37e < 0x100) * (char)sStack_37e
                                         - (0xff < sStack_37e),
                                         CONCAT14((0 < sStack_380) * (sStack_380 < 0x100) *
                                                  (char)sStack_380 - (0xff < sStack_380),
                                                  CONCAT13((0 < sStack_382) * (sStack_382 < 0x100) *
                                                           (char)sStack_382 - (0xff < sStack_382),
                                                           CONCAT12((0 < sStack_384) *
                                                                    (sStack_384 < 0x100) *
                                                                    (char)sStack_384 -
                                                                    (0xff < sStack_384),
                                                                    (ushort)local_bc8))))));
  local_bd8._0_2_ =
       CONCAT11((0 < sStack_3a6) * (sStack_3a6 < 0x100) * (char)sStack_3a6 - (0xff < sStack_3a6),
                (0 < local_3a8) * (local_3a8 < 0x100) * (char)local_3a8 - (0xff < local_3a8));
  local_bd8 = CONCAT17((0 < sStack_39a) * (sStack_39a < 0x100) * (char)sStack_39a -
                       (0xff < sStack_39a),
                       CONCAT16((0 < sStack_39c) * (sStack_39c < 0x100) * (char)sStack_39c -
                                (0xff < sStack_39c),
                                CONCAT15((0 < sStack_39e) * (sStack_39e < 0x100) * (char)sStack_39e
                                         - (0xff < sStack_39e),
                                         CONCAT14((0 < sStack_3a0) * (sStack_3a0 < 0x100) *
                                                  (char)sStack_3a0 - (0xff < sStack_3a0),
                                                  CONCAT13((0 < sStack_3a2) * (sStack_3a2 < 0x100) *
                                                           (char)sStack_3a2 - (0xff < sStack_3a2),
                                                           CONCAT12((0 < sStack_3a4) *
                                                                    (sStack_3a4 < 0x100) *
                                                                    (char)sStack_3a4 -
                                                                    (0xff < sStack_3a4),
                                                                    (ushort)local_bd8))))));
  local_be8._0_2_ =
       CONCAT11((0 < sStack_3c6) * (sStack_3c6 < 0x100) * (char)sStack_3c6 - (0xff < sStack_3c6),
                (0 < local_3c8) * (local_3c8 < 0x100) * (char)local_3c8 - (0xff < local_3c8));
  local_be8 = CONCAT17((0 < sStack_3ba) * (sStack_3ba < 0x100) * (char)sStack_3ba -
                       (0xff < sStack_3ba),
                       CONCAT16((0 < sStack_3bc) * (sStack_3bc < 0x100) * (char)sStack_3bc -
                                (0xff < sStack_3bc),
                                CONCAT15((0 < sStack_3be) * (sStack_3be < 0x100) * (char)sStack_3be
                                         - (0xff < sStack_3be),
                                         CONCAT14((0 < sStack_3c0) * (sStack_3c0 < 0x100) *
                                                  (char)sStack_3c0 - (0xff < sStack_3c0),
                                                  CONCAT13((0 < sStack_3c2) * (sStack_3c2 < 0x100) *
                                                           (char)sStack_3c2 - (0xff < sStack_3c2),
                                                           CONCAT12((0 < sStack_3c4) *
                                                                    (sStack_3c4 < 0x100) *
                                                                    (char)sStack_3c4 -
                                                                    (0xff < sStack_3c4),
                                                                    (ushort)local_be8))))));
  local_bf8._0_2_ =
       CONCAT11((0 < sStack_3e6) * (sStack_3e6 < 0x100) * (char)sStack_3e6 - (0xff < sStack_3e6),
                (0 < local_3e8) * (local_3e8 < 0x100) * (char)local_3e8 - (0xff < local_3e8));
  local_bf8 = CONCAT17((0 < sStack_3da) * (sStack_3da < 0x100) * (char)sStack_3da -
                       (0xff < sStack_3da),
                       CONCAT16((0 < sStack_3dc) * (sStack_3dc < 0x100) * (char)sStack_3dc -
                                (0xff < sStack_3dc),
                                CONCAT15((0 < sStack_3de) * (sStack_3de < 0x100) * (char)sStack_3de
                                         - (0xff < sStack_3de),
                                         CONCAT14((0 < sStack_3e0) * (sStack_3e0 < 0x100) *
                                                  (char)sStack_3e0 - (0xff < sStack_3e0),
                                                  CONCAT13((0 < sStack_3e2) * (sStack_3e2 < 0x100) *
                                                           (char)sStack_3e2 - (0xff < sStack_3e2),
                                                           CONCAT12((0 < sStack_3e4) *
                                                                    (sStack_3e4 < 0x100) *
                                                                    (char)sStack_3e4 -
                                                                    (0xff < sStack_3e4),
                                                                    (ushort)local_bf8))))));
  *local_860 = local_bc8;
  local_860[4] = local_bd8;
  local_860[8] = local_be8;
  local_860[0xc] = local_bf8;
  return;
}

Assistant:

static void ITransform_Two_SSE2(const uint8_t* WEBP_RESTRICT ref,
                                const int16_t* WEBP_RESTRICT in,
                                uint8_t* WEBP_RESTRICT dst) {
  // This implementation makes use of 16-bit fixed point versions of two
  // multiply constants:
  //    K1 = sqrt(2) * cos (pi/8) ~= 85627 / 2^16
  //    K2 = sqrt(2) * sin (pi/8) ~= 35468 / 2^16
  //
  // To be able to use signed 16-bit integers, we use the following trick to
  // have constants within range:
  // - Associated constants are obtained by subtracting the 16-bit fixed point
  //   version of one:
  //      k = K - (1 << 16)  =>  K = k + (1 << 16)
  //      K1 = 85267  =>  k1 =  20091
  //      K2 = 35468  =>  k2 = -30068
  // - The multiplication of a variable by a constant become the sum of the
  //   variable and the multiplication of that variable by the associated
  //   constant:
  //      (x * K) >> 16 = (x * (k + (1 << 16))) >> 16 = ((x * k ) >> 16) + x
  const __m128i k1 = _mm_set1_epi16(20091);
  const __m128i k2 = _mm_set1_epi16(-30068);
  __m128i T0, T1, T2, T3;

  // Load and concatenate the transform coefficients (we'll do two inverse
  // transforms in parallel).
  __m128i in0, in1, in2, in3;
  {
    const __m128i tmp0 = _mm_loadu_si128((const __m128i*)&in[0]);
    const __m128i tmp1 = _mm_loadu_si128((const __m128i*)&in[8]);
    const __m128i tmp2 = _mm_loadu_si128((const __m128i*)&in[16]);
    const __m128i tmp3 = _mm_loadu_si128((const __m128i*)&in[24]);
    in0 = _mm_unpacklo_epi64(tmp0, tmp2);
    in1 = _mm_unpackhi_epi64(tmp0, tmp2);
    in2 = _mm_unpacklo_epi64(tmp1, tmp3);
    in3 = _mm_unpackhi_epi64(tmp1, tmp3);
    // a00 a10 a20 a30   b00 b10 b20 b30
    // a01 a11 a21 a31   b01 b11 b21 b31
    // a02 a12 a22 a32   b02 b12 b22 b32
    // a03 a13 a23 a33   b03 b13 b23 b33
  }

  // Vertical pass and subsequent transpose.
  {
    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    const __m128i a = _mm_add_epi16(in0, in2);
    const __m128i b = _mm_sub_epi16(in0, in2);
    // c = MUL(in1, K2) - MUL(in3, K1) = MUL(in1, k2) - MUL(in3, k1) + in1 - in3
    const __m128i c1 = _mm_mulhi_epi16(in1, k2);
    const __m128i c2 = _mm_mulhi_epi16(in3, k1);
    const __m128i c3 = _mm_sub_epi16(in1, in3);
    const __m128i c4 = _mm_sub_epi16(c1, c2);
    const __m128i c = _mm_add_epi16(c3, c4);
    // d = MUL(in1, K1) + MUL(in3, K2) = MUL(in1, k1) + MUL(in3, k2) + in1 + in3
    const __m128i d1 = _mm_mulhi_epi16(in1, k1);
    const __m128i d2 = _mm_mulhi_epi16(in3, k2);
    const __m128i d3 = _mm_add_epi16(in1, in3);
    const __m128i d4 = _mm_add_epi16(d1, d2);
    const __m128i d = _mm_add_epi16(d3, d4);

    // Second pass.
    const __m128i tmp0 = _mm_add_epi16(a, d);
    const __m128i tmp1 = _mm_add_epi16(b, c);
    const __m128i tmp2 = _mm_sub_epi16(b, c);
    const __m128i tmp3 = _mm_sub_epi16(a, d);

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&tmp0, &tmp1, &tmp2, &tmp3, &T0, &T1, &T2, &T3);
  }

  // Horizontal pass and subsequent transpose.
  {
    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    const __m128i four = _mm_set1_epi16(4);
    const __m128i dc = _mm_add_epi16(T0, four);
    const __m128i a =  _mm_add_epi16(dc, T2);
    const __m128i b =  _mm_sub_epi16(dc, T2);
    // c = MUL(T1, K2) - MUL(T3, K1) = MUL(T1, k2) - MUL(T3, k1) + T1 - T3
    const __m128i c1 = _mm_mulhi_epi16(T1, k2);
    const __m128i c2 = _mm_mulhi_epi16(T3, k1);
    const __m128i c3 = _mm_sub_epi16(T1, T3);
    const __m128i c4 = _mm_sub_epi16(c1, c2);
    const __m128i c = _mm_add_epi16(c3, c4);
    // d = MUL(T1, K1) + MUL(T3, K2) = MUL(T1, k1) + MUL(T3, k2) + T1 + T3
    const __m128i d1 = _mm_mulhi_epi16(T1, k1);
    const __m128i d2 = _mm_mulhi_epi16(T3, k2);
    const __m128i d3 = _mm_add_epi16(T1, T3);
    const __m128i d4 = _mm_add_epi16(d1, d2);
    const __m128i d = _mm_add_epi16(d3, d4);

    // Second pass.
    const __m128i tmp0 = _mm_add_epi16(a, d);
    const __m128i tmp1 = _mm_add_epi16(b, c);
    const __m128i tmp2 = _mm_sub_epi16(b, c);
    const __m128i tmp3 = _mm_sub_epi16(a, d);
    const __m128i shifted0 = _mm_srai_epi16(tmp0, 3);
    const __m128i shifted1 = _mm_srai_epi16(tmp1, 3);
    const __m128i shifted2 = _mm_srai_epi16(tmp2, 3);
    const __m128i shifted3 = _mm_srai_epi16(tmp3, 3);

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&shifted0, &shifted1, &shifted2, &shifted3, &T0, &T1,
                           &T2, &T3);
  }

  // Add inverse transform to 'ref' and store.
  {
    const __m128i zero = _mm_setzero_si128();
    // Load the reference(s).
    __m128i ref0, ref1, ref2, ref3;
    // Load eight bytes/pixels per line.
    ref0 = _mm_loadl_epi64((const __m128i*)&ref[0 * BPS]);
    ref1 = _mm_loadl_epi64((const __m128i*)&ref[1 * BPS]);
    ref2 = _mm_loadl_epi64((const __m128i*)&ref[2 * BPS]);
    ref3 = _mm_loadl_epi64((const __m128i*)&ref[3 * BPS]);
    // Convert to 16b.
    ref0 = _mm_unpacklo_epi8(ref0, zero);
    ref1 = _mm_unpacklo_epi8(ref1, zero);
    ref2 = _mm_unpacklo_epi8(ref2, zero);
    ref3 = _mm_unpacklo_epi8(ref3, zero);
    // Add the inverse transform(s).
    ref0 = _mm_add_epi16(ref0, T0);
    ref1 = _mm_add_epi16(ref1, T1);
    ref2 = _mm_add_epi16(ref2, T2);
    ref3 = _mm_add_epi16(ref3, T3);
    // Unsigned saturate to 8b.
    ref0 = _mm_packus_epi16(ref0, ref0);
    ref1 = _mm_packus_epi16(ref1, ref1);
    ref2 = _mm_packus_epi16(ref2, ref2);
    ref3 = _mm_packus_epi16(ref3, ref3);
    // Store eight bytes/pixels per line.
    _mm_storel_epi64((__m128i*)&dst[0 * BPS], ref0);
    _mm_storel_epi64((__m128i*)&dst[1 * BPS], ref1);
    _mm_storel_epi64((__m128i*)&dst[2 * BPS], ref2);
    _mm_storel_epi64((__m128i*)&dst[3 * BPS], ref3);
  }
}